

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O0

void __thiscall iDynTree::Visualizer::~Visualizer(Visualizer *this)

{
  _func_int **pp_Var1;
  int in_ESI;
  VisualizerPimpl *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__Visualizer_00110280;
  close((Visualizer *)in_RDI,in_ESI);
  pp_Var1 = (in_RDI->m_invalidModelViz).super_IModelVisualization._vptr_IModelVisualization;
  if (pp_Var1 != (_func_int **)0x0) {
    VisualizerPimpl::~VisualizerPimpl(in_RDI);
    operator_delete(pp_Var1,0x1b8);
  }
  (in_RDI->m_invalidModelViz).super_IModelVisualization._vptr_IModelVisualization =
       (_func_int **)0x0;
  return;
}

Assistant:

Visualizer::~Visualizer()
{
    close();

    delete pimpl;
    pimpl = 0;
}